

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binder.h
# Opt level: O0

void __thiscall
cppcms::impl::
event_handler_binder_p1<void_(cppcms::impl::cgi::fastcgi::*)(const_std::error_code_&,_const_booster::callback<void_(const_std::error_code_&)>_&),_std::shared_ptr<cppcms::impl::cgi::fastcgi>,_booster::callback<void_(const_std::error_code_&)>_>
::event_handler_binder_p1
          (event_handler_binder_p1<void_(cppcms::impl::cgi::fastcgi::*)(const_std::error_code_&,_const_booster::callback<void_(const_std::error_code_&)>_&),_std::shared_ptr<cppcms::impl::cgi::fastcgi>,_booster::callback<void_(const_std::error_code_&)>_>
           *this,offset_in_fastcgi_to_subr *f,shared_ptr<cppcms::impl::cgi::fastcgi> *s,
          callback<void_(const_std::error_code_&)> *p1)

{
  undefined8 uVar1;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  shared_ptr<cppcms::impl::cgi::fastcgi> *in_stack_ffffffffffffffb8;
  callable<void_(const_std::error_code_&)> *in_stack_ffffffffffffffc0;
  shared_ptr<cppcms::impl::cgi::fastcgi> *this_00;
  
  booster::callable<void_(const_std::error_code_&)>::callable(in_stack_ffffffffffffffc0);
  *in_RDI = &PTR__event_handler_binder_p1_005307e8;
  uVar1 = *in_RSI;
  in_RDI[3] = in_RSI[1];
  in_RDI[2] = uVar1;
  this_00 = (shared_ptr<cppcms::impl::cgi::fastcgi> *)(in_RDI + 4);
  std::shared_ptr<cppcms::impl::cgi::fastcgi>::shared_ptr(this_00,in_stack_ffffffffffffffb8);
  booster::callback<void_(const_std::error_code_&)>::callback
            ((callback<void_(const_std::error_code_&)> *)this_00,
             (callback<void_(const_std::error_code_&)> *)in_stack_ffffffffffffffb8);
  return;
}

Assistant:

event_handler_binder_p1(F const &f,S const &s, P1 const &p1) : f_(f), s_(s), p1_(p1) {}